

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O1

size_t get_FMfieldLong_by_name(FMFieldList field_list,char *fieldname,void *data)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  FMgetFieldStruct descr;
  _FMgetFieldStruct local_38;
  
  bVar3 = field_list->field_name == (char *)0x0;
  if (!bVar3) {
    iVar1 = strcmp(field_list->field_name,fieldname);
    while (iVar1 != 0) {
      bVar3 = field_list[1].field_name == (char *)0x0;
      if (bVar3) goto LAB_00122d1c;
      iVar1 = strcmp(field_list[1].field_name,fieldname);
      field_list = field_list + 1;
    }
    if (!bVar3) {
      local_38.offset = (size_t)field_list->field_offset;
      local_38.size = field_list->field_size;
      local_38.data_type = integer_type;
      local_38.byte_swap = '\0';
      local_38.src_float_format = '\x01';
      local_38.target_float_format = '\x01';
      sVar2 = get_big_int(&local_38,data);
      return sVar2;
    }
  }
LAB_00122d1c:
  printf("Field %s not found\n",fieldname);
  return 0;
}

Assistant:

extern size_t
get_FMfieldLong_by_name(FMFieldList field_list, const char *fieldname, void *data)
{
    int index;
    FMgetFieldStruct descr;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL) {
	printf("Field %s not found\n", fieldname);
	return 0;
    }

    descr.offset = field_list[index].field_offset;
    descr.size = field_list[index].field_size;
    descr.data_type = integer_type;
    descr.byte_swap = 0;
    descr.src_float_format = descr.target_float_format = Format_IEEE_754_bigendian;
    return get_FMlong(&descr, data);
}